

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

BlockEntry * __thiscall mkvparser::Cluster::GetEntry(Cluster *this,CuePoint *cp,TrackPosition *tp)

{
  long lVar1;
  Tracks *this_00;
  bool bVar2;
  int iVar3;
  long lVar4;
  Block *pBVar5;
  undefined4 extraout_var_00;
  longlong lVar6;
  Track *pTVar7;
  long lVar8;
  BlockEntry *unaff_R15;
  BlockEntry *pBVar9;
  long len;
  longlong pos;
  long local_40;
  longlong local_38;
  undefined4 extraout_var;
  
  if (this->m_pSegment == (Segment *)0x0) {
    __assert_fail("m_pSegment",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1d3b,
                  "const BlockEntry *mkvparser::Cluster::GetEntry(const CuePoint &, const CuePoint::TrackPosition &) const"
                 );
  }
  lVar1 = cp->m_timecode;
  lVar8 = tp->m_block;
  if (0 < lVar8) {
    do {
      if (lVar8 <= this->m_entries_count) {
        unaff_R15 = this->m_entries[lVar8 + -1];
        if (unaff_R15 == (BlockEntry *)0x0) {
          __assert_fail("pEntry",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x1d50,
                        "const BlockEntry *mkvparser::Cluster::GetEntry(const CuePoint &, const CuePoint::TrackPosition &) const"
                       );
        }
        iVar3 = (*unaff_R15->_vptr_BlockEntry[3])(unaff_R15);
        if (iVar3 == 0) {
          __assert_fail("!pEntry->EOS()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x1d51,
                        "const BlockEntry *mkvparser::Cluster::GetEntry(const CuePoint &, const CuePoint::TrackPosition &) const"
                       );
        }
        iVar3 = (*unaff_R15->_vptr_BlockEntry[2])(unaff_R15);
        pBVar5 = (Block *)CONCAT44(extraout_var,iVar3);
        if (pBVar5 == (Block *)0x0) {
          __assert_fail("pBlock",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x1d54,
                        "const BlockEntry *mkvparser::Cluster::GetEntry(const CuePoint &, const CuePoint::TrackPosition &) const"
                       );
        }
        if ((pBVar5->m_track == tp->m_track) &&
           (lVar6 = Block::GetTimeCode(pBVar5,this), lVar6 == lVar1)) {
          bVar2 = false;
          goto LAB_00127f18;
        }
        bVar2 = true;
        goto LAB_00127f15;
      }
      lVar4 = Parse(this,&local_38,&local_40);
    } while ((-1 < lVar4) && (lVar4 == 0));
    bVar2 = false;
LAB_00127f15:
    unaff_R15 = (BlockEntry *)0x0;
LAB_00127f18:
    if (!bVar2) {
      return unaff_R15;
    }
  }
  lVar8 = 0;
  do {
    pBVar9 = unaff_R15;
    if (this->m_entries_count <= lVar8) {
      lVar4 = Parse(this,&local_38,&local_40);
      if (lVar4 == 0) {
        if (this->m_entries == (BlockEntry **)0x0) {
          __assert_fail("m_entries",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x1d6b,
                        "const BlockEntry *mkvparser::Cluster::GetEntry(const CuePoint &, const CuePoint::TrackPosition &) const"
                       );
        }
        if (this->m_entries_count <= lVar8) {
          __assert_fail("index < m_entries_count",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x1d6c,
                        "const BlockEntry *mkvparser::Cluster::GetEntry(const CuePoint &, const CuePoint::TrackPosition &) const"
                       );
        }
      }
      else {
        unaff_R15 = (BlockEntry *)0x0;
      }
      pBVar9 = unaff_R15;
      if (lVar4 != 0) {
        return unaff_R15;
      }
    }
    unaff_R15 = this->m_entries[lVar8];
    if (unaff_R15 == (BlockEntry *)0x0) {
      __assert_fail("pEntry",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x1d70,
                    "const BlockEntry *mkvparser::Cluster::GetEntry(const CuePoint &, const CuePoint::TrackPosition &) const"
                   );
    }
    iVar3 = (*unaff_R15->_vptr_BlockEntry[3])(unaff_R15);
    if (iVar3 == 0) {
      __assert_fail("!pEntry->EOS()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x1d71,
                    "const BlockEntry *mkvparser::Cluster::GetEntry(const CuePoint &, const CuePoint::TrackPosition &) const"
                   );
    }
    iVar3 = (*unaff_R15->_vptr_BlockEntry[2])(unaff_R15);
    pBVar5 = (Block *)CONCAT44(extraout_var_00,iVar3);
    if (pBVar5 == (Block *)0x0) {
      __assert_fail("pBlock",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x1d74,
                    "const BlockEntry *mkvparser::Cluster::GetEntry(const CuePoint &, const CuePoint::TrackPosition &) const"
                   );
    }
    if ((pBVar5->m_track == tp->m_track) &&
       (lVar6 = Block::GetTimeCode(pBVar5,this), lVar1 <= lVar6)) {
      if (lVar6 <= lVar1) {
        this_00 = this->m_pSegment->m_pTracks;
        if (this_00 == (Tracks *)0x0) {
          __assert_fail("pTracks",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x1d86,
                        "const BlockEntry *mkvparser::Cluster::GetEntry(const CuePoint &, const CuePoint::TrackPosition &) const"
                       );
        }
        pTVar7 = Tracks::GetTrackByNumber(this_00,tp->m_track);
        if (pTVar7 != (Track *)0x0) {
          lVar4 = (pTVar7->m_info).type;
          if (lVar4 == 1) {
            if (-1 < (char)pBVar5->m_flags) {
              unaff_R15 = (BlockEntry *)0x0;
            }
          }
          else if (lVar4 != 2) goto LAB_00127ff3;
          bVar2 = false;
          goto LAB_00128009;
        }
      }
LAB_00127ff3:
      bVar2 = false;
      unaff_R15 = (BlockEntry *)0x0;
    }
    else {
      lVar8 = lVar8 + 1;
      bVar2 = true;
      unaff_R15 = pBVar9;
    }
LAB_00128009:
    if (!bVar2) {
      return unaff_R15;
    }
  } while( true );
}

Assistant:

const BlockEntry* Cluster::GetEntry(const CuePoint& cp,
                                    const CuePoint::TrackPosition& tp) const {
  assert(m_pSegment);
  const long long tc = cp.GetTimeCode();

  if (tp.m_block > 0) {
    const long block = static_cast<long>(tp.m_block);
    const long index = block - 1;

    while (index >= m_entries_count) {
      long long pos;
      long len;

      const long status = Parse(pos, len);

      if (status < 0)  // TODO: can this happen?
        return NULL;

      if (status > 0)  // nothing remains to be parsed
        return NULL;
    }

    const BlockEntry* const pEntry = m_entries[index];
    assert(pEntry);
    assert(!pEntry->EOS());

    const Block* const pBlock = pEntry->GetBlock();
    assert(pBlock);

    if ((pBlock->GetTrackNumber() == tp.m_track) &&
        (pBlock->GetTimeCode(this) == tc)) {
      return pEntry;
    }
  }

  long index = 0;

  for (;;) {
    if (index >= m_entries_count) {
      long long pos;
      long len;

      const long status = Parse(pos, len);

      if (status < 0)  // TODO: can this happen?
        return NULL;

      if (status > 0)  // nothing remains to be parsed
        return NULL;

      assert(m_entries);
      assert(index < m_entries_count);
    }

    const BlockEntry* const pEntry = m_entries[index];
    assert(pEntry);
    assert(!pEntry->EOS());

    const Block* const pBlock = pEntry->GetBlock();
    assert(pBlock);

    if (pBlock->GetTrackNumber() != tp.m_track) {
      ++index;
      continue;
    }

    const long long tc_ = pBlock->GetTimeCode(this);

    if (tc_ < tc) {
      ++index;
      continue;
    }

    if (tc_ > tc)
      return NULL;

    const Tracks* const pTracks = m_pSegment->GetTracks();
    assert(pTracks);

    const long tn = static_cast<long>(tp.m_track);
    const Track* const pTrack = pTracks->GetTrackByNumber(tn);

    if (pTrack == NULL)
      return NULL;

    const long long type = pTrack->GetType();

    if (type == 2)  // audio
      return pEntry;

    if (type != 1)  // not video
      return NULL;

    if (!pBlock->IsKey())
      return NULL;

    return pEntry;
  }
}